

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionDispatcherMt.cpp
# Opt level: O3

void __thiscall
cbtCollisionDispatcherMt::dispatchAllCollisionPairs
          (cbtCollisionDispatcherMt *this,cbtOverlappingPairCache *pairCache,cbtDispatcherInfo *info
          ,cbtDispatcher *dispatcher)

{
  cbtPersistentManifold **ptr;
  long *plVar1;
  undefined1 auVar2 [32];
  ulong uVar3;
  uint iEnd;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar11 [32];
  cbtIParallelForBody local_58;
  undefined8 local_50;
  cbtNearCallback local_48;
  cbtCollisionDispatcherMt *local_40;
  cbtDispatcherInfo *local_38;
  undefined1 auVar10 [64];
  
  iEnd = (*(pairCache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback[9])
                   (pairCache);
  if (iEnd != 0) {
    local_58._vptr_cbtIParallelForBody = (_func_int **)&PTR__cbtIParallelForBody_00b47bd8;
    local_48 = (this->super_cbtCollisionDispatcher).m_nearCallback;
    iVar4 = (*(pairCache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback[5])();
    local_50 = CONCAT44(extraout_var,iVar4);
    this->m_batchUpdating = true;
    local_40 = this;
    local_38 = info;
    cbtParallelFor(0,iEnd,this->m_grainSize,&local_58);
    this->m_batchUpdating = false;
    if (((this->super_cbtCollisionDispatcher).m_manifoldsPtr.m_size < 0) &&
       ((this->super_cbtCollisionDispatcher).m_manifoldsPtr.m_capacity < 0)) {
      ptr = (this->super_cbtCollisionDispatcher).m_manifoldsPtr.m_data;
      if ((ptr != (cbtPersistentManifold **)0x0) &&
         ((this->super_cbtCollisionDispatcher).m_manifoldsPtr.m_ownsMemory == true)) {
        cbtAlignedFreeInternal(ptr);
      }
      (this->super_cbtCollisionDispatcher).m_manifoldsPtr.m_ownsMemory = true;
      (this->super_cbtCollisionDispatcher).m_manifoldsPtr.m_data = (cbtPersistentManifold **)0x0;
      (this->super_cbtCollisionDispatcher).m_manifoldsPtr.m_capacity = 0;
    }
    (this->super_cbtCollisionDispatcher).m_manifoldsPtr.m_size = 0;
    iVar4 = (*(pairCache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback[5])
                      (pairCache);
    if (0 < (int)iEnd) {
      lVar5 = 0;
      do {
        plVar1 = *(long **)(CONCAT44(extraout_var_00,iVar4) + 0x10 + lVar5);
        if (plVar1 != (long *)0x0) {
          (**(code **)(*plVar1 + 0x20))(plVar1,&(this->super_cbtCollisionDispatcher).m_manifoldsPtr)
          ;
        }
        lVar5 = lVar5 + 0x20;
      } while ((ulong)iEnd << 5 != lVar5);
    }
    iVar4 = (this->super_cbtCollisionDispatcher).m_manifoldsPtr.m_size;
    if (0 < iVar4) {
      auVar2 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
      auVar7 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar8 = vpbroadcastq_avx512f(ZEXT816(8));
      auVar11._8_4_ = 8;
      auVar11._0_8_ = 0x800000008;
      auVar11._12_4_ = 8;
      auVar11._16_4_ = 8;
      auVar11._20_4_ = 8;
      auVar11._24_4_ = 8;
      auVar11._28_4_ = 8;
      auVar9 = vpbroadcastq_avx512f();
      lVar5 = 0;
      do {
        uVar3 = vpcmpuq_avx512f(auVar7,auVar9,2);
        auVar7 = vpaddq_avx512f(auVar7,auVar8);
        auVar10 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                     ((long)(this->super_cbtCollisionDispatcher).m_manifoldsPtr.
                                            m_data + lVar5));
        auVar6._8_8_ = (ulong)((byte)(uVar3 >> 1) & 1) * auVar10._8_8_;
        auVar6._0_8_ = (ulong)((byte)uVar3 & 1) * auVar10._0_8_;
        auVar6._16_8_ = (ulong)((byte)(uVar3 >> 2) & 1) * auVar10._16_8_;
        auVar6._24_8_ = (ulong)((byte)(uVar3 >> 3) & 1) * auVar10._24_8_;
        lVar5 = lVar5 + 0x40;
        vpscatterqd_avx512f(ZEXT832(0x3ac) + auVar6,uVar3,auVar2);
        auVar2 = vpaddd_avx2(auVar2,auVar11);
      } while ((ulong)(iVar4 + 7U >> 3) << 6 != lVar5);
    }
  }
  return;
}

Assistant:

void cbtCollisionDispatcherMt::dispatchAllCollisionPairs(cbtOverlappingPairCache* pairCache, const cbtDispatcherInfo& info, cbtDispatcher* dispatcher)
{
	int pairCount = pairCache->getNumOverlappingPairs();
	if (pairCount == 0)
	{
		return;
	}
	CollisionDispatcherUpdater updater;
	updater.mCallback = getNearCallback();
	updater.mPairArray = pairCache->getOverlappingPairArrayPtr();
	updater.mDispatcher = this;
	updater.mInfo = &info;

	m_batchUpdating = true;
	cbtParallelFor(0, pairCount, m_grainSize, updater);
	m_batchUpdating = false;

	// reconstruct the manifolds array to ensure determinism
	m_manifoldsPtr.resizeNoInitialize(0);

	cbtBroadphasePair* pairs = pairCache->getOverlappingPairArrayPtr();
	for (int i = 0; i < pairCount; ++i)
	{
		if (cbtCollisionAlgorithm* algo = pairs[i].m_algorithm)
		{
			algo->getAllContactManifolds(m_manifoldsPtr);
		}
	}

	// update the indices (used when releasing manifolds)
	for (int i = 0; i < m_manifoldsPtr.size(); ++i)
	{
		m_manifoldsPtr[i]->m_index1a = i;
	}
}